

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PLYReader.cc
# Opt level: O3

void __thiscall
OpenMesh::IO::_PLYReader_::readValue(_PLYReader_ *this,ValueType _type,istream *_in,float *_value)

{
  long *plVar1;
  float local_1c [2];
  float32_t tmp;
  
  if (_type - ValueTypeFLOAT32 < 2) {
    binary<float>::restore(_in,local_1c,SUB41(((this->options_).flags_ & 2U) >> 1,0));
    *_value = local_1c[0];
    return;
  }
  *_value = 0.0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"unsupported conversion type to float: ",0x26);
  plVar1 = (long *)std::ostream::operator<<(&std::cerr,_type);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return;
}

Assistant:

void _PLYReader_::readValue(ValueType _type, std::istream& _in, float& _value) const {

    switch (_type) {
    case ValueTypeFLOAT32:
    case ValueTypeFLOAT:
        float32_t tmp;
        restore(_in, tmp, options_.check(Options::MSB));
        _value = tmp;
        break;
    default:
        _value = 0.0;
        std::cerr << "unsupported conversion type to float: " << _type << std::endl;
        break;
    }
}